

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void VmPopOperand(jx9_value **ppTos,sxi32 nPop)

{
  jx9_value *local_20;
  jx9_value *pTos;
  sxi32 nPop_local;
  jx9_value **ppTos_local;
  
  local_20 = *ppTos;
  for (pTos._4_4_ = nPop; 0 < pTos._4_4_; pTos._4_4_ = pTos._4_4_ + -1) {
    jx9MemObjRelease(local_20);
    local_20 = local_20 + -1;
  }
  *ppTos = local_20;
  return;
}

Assistant:

static void VmPopOperand(
	jx9_value **ppTos, /* Operand stack */
	sxi32 nPop         /* Total number of memory objects to pop */
	)
{
	jx9_value *pTos = *ppTos;
	while( nPop > 0 ){
		jx9MemObjRelease(pTos);
		pTos--;
		nPop--;
	}
	/* Top of the stack */
	*ppTos = pTos;
}